

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net_processing.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_2e8af7c::PeerManagerImpl::BlockConnected
          (PeerManagerImpl *this,ChainstateRole role,shared_ptr<const_CBlock> *pblock,
          CBlockIndex *pindex)

{
  long lVar1;
  long lVar2;
  element_type *peVar3;
  pointer psVar4;
  time_point tVar5;
  Logger *this_00;
  CRollingBloomFilter *pCVar6;
  shared_ptr<const_CTransaction> *ptx;
  mutex_type *pmVar7;
  pointer psVar8;
  long in_FS_OFFSET;
  bool bVar9;
  Span<const_unsigned_char> vKey;
  Span<const_unsigned_char> vKey_00;
  string_view source_file;
  string_view logging_function;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock40;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  tVar5 = NodeClock::now();
  LOCK();
  (this->m_last_tip_update)._M_i.__r = (long)tVar5.__d.__r / 1000000000;
  UNLOCK();
  lVar2 = (this->m_block_stalling_timeout)._M_i.__r;
  if (lVar2 != 2) {
    pmVar7 = (mutex_type *)0x2;
    if (2 < (long)((double)lVar2 * 0.85)) {
      pmVar7 = (mutex_type *)(long)((double)lVar2 * 0.85);
    }
    LOCK();
    bVar9 = lVar2 == (this->m_block_stalling_timeout)._M_i.__r;
    if (bVar9) {
      (this->m_block_stalling_timeout)._M_i.__r = (rep)pmVar7;
    }
    UNLOCK();
    if (bVar9) {
      this_00 = LogInstance();
      bVar9 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
      if (bVar9) {
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net_processing.cpp"
        ;
        source_file._M_len = 0x5b;
        logging_function._M_str = "BlockConnected";
        logging_function._M_len = 0xe;
        criticalblock40.super_unique_lock._M_device = pmVar7;
        LogPrintf_<long>(logging_function,source_file,0x86b,NET,Debug,
                         "Decreased stalling timeout to %d seconds\n",(long *)&criticalblock40);
      }
    }
  }
  if (role != BACKGROUND) {
    criticalblock40.super_unique_lock._M_device = &(this->m_tx_download_mutex).super_mutex;
    criticalblock40.super_unique_lock._M_owns = false;
    std::unique_lock<std::mutex>::lock(&criticalblock40.super_unique_lock);
    TxOrphanage::EraseForBlock
              (&this->m_orphanage,
               (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    peVar3 = (pblock->super___shared_ptr<const_CBlock,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    psVar8 = (peVar3->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar4 = (peVar3->vtx).
             super__Vector_base<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar8 != psVar4) {
      do {
        pCVar6 = RecentConfirmedTransactionsFilter(this);
        vKey.m_data = &((psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)
                       ._M_ptr)->hash;
        vKey.m_size = 0x20;
        CRollingBloomFilter::insert(pCVar6,vKey);
        if (((psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
            m_has_witness == true) {
          pCVar6 = RecentConfirmedTransactionsFilter(this);
          vKey_00.m_data =
               &((psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                )->m_witness_hash;
          vKey_00.m_size = 0x20;
          CRollingBloomFilter::insert(pCVar6,vKey_00);
        }
        TxRequestTracker::ForgetTxHash
                  (&this->m_txrequest,
                   &(((psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->hash).m_wrapped);
        TxRequestTracker::ForgetTxHash
                  (&this->m_txrequest,
                   &(((psVar8->super___shared_ptr<const_CTransaction,_(__gnu_cxx::_Lock_policy)2>).
                     _M_ptr)->m_witness_hash).m_wrapped);
        psVar8 = psVar8 + 1;
      } while (psVar8 != psVar4);
    }
    std::unique_lock<std::mutex>::~unique_lock(&criticalblock40.super_unique_lock);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void PeerManagerImpl::BlockConnected(
    ChainstateRole role,
    const std::shared_ptr<const CBlock>& pblock,
    const CBlockIndex* pindex)
{
    // Update this for all chainstate roles so that we don't mistakenly see peers
    // helping us do background IBD as having a stale tip.
    m_last_tip_update = GetTime<std::chrono::seconds>();

    // In case the dynamic timeout was doubled once or more, reduce it slowly back to its default value
    auto stalling_timeout = m_block_stalling_timeout.load();
    Assume(stalling_timeout >= BLOCK_STALLING_TIMEOUT_DEFAULT);
    if (stalling_timeout != BLOCK_STALLING_TIMEOUT_DEFAULT) {
        const auto new_timeout = std::max(std::chrono::duration_cast<std::chrono::seconds>(stalling_timeout * 0.85), BLOCK_STALLING_TIMEOUT_DEFAULT);
        if (m_block_stalling_timeout.compare_exchange_strong(stalling_timeout, new_timeout)) {
            LogDebug(BCLog::NET, "Decreased stalling timeout to %d seconds\n", count_seconds(new_timeout));
        }
    }

    // The following task can be skipped since we don't maintain a mempool for
    // the ibd/background chainstate.
    if (role == ChainstateRole::BACKGROUND) {
        return;
    }
    LOCK(m_tx_download_mutex);
    m_orphanage.EraseForBlock(*pblock);

    for (const auto& ptx : pblock->vtx) {
        RecentConfirmedTransactionsFilter().insert(ptx->GetHash().ToUint256());
        if (ptx->HasWitness()) {
            RecentConfirmedTransactionsFilter().insert(ptx->GetWitnessHash().ToUint256());
        }
        m_txrequest.ForgetTxHash(ptx->GetHash());
        m_txrequest.ForgetTxHash(ptx->GetWitnessHash());
    }
}